

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O0

optional_ptr<duckdb::EncodingFunction,_true> __thiscall
duckdb::DBConfig::GetEncodeFunction(DBConfig *this,string *name)

{
  bool bVar1;
  mapped_type *ptr_p;
  lock_guard<std::mutex> l;
  key_type *in_stack_ffffffffffffff78;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>_>
  *in_stack_ffffffffffffff80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>,_true>
  local_40 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>,_true>
  local_28 [4];
  optional_ptr<duckdb::EncodingFunction,_true> local_8;
  
  unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>::
  operator->((unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
              *)in_stack_ffffffffffffff80);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
             (mutex_type *)in_stack_ffffffffffffff78);
  unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>::
  operator->((unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
              *)in_stack_ffffffffffffff80);
  local_28[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x2a533ed);
  unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>::
  operator->((unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
              *)in_stack_ffffffffffffff80);
  local_40[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = ::std::__detail::operator!=(local_28,local_40);
  if (bVar1) {
    unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
    ::operator->((unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
                  *)in_stack_ffffffffffffff80);
    ptr_p = ::std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>_>
            ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    optional_ptr<duckdb::EncodingFunction,_true>::optional_ptr(&local_8,ptr_p);
  }
  else {
    optional_ptr<duckdb::EncodingFunction,_true>::optional_ptr(&local_8,(EncodingFunction *)0x0);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2a534cd);
  return (optional_ptr<duckdb::EncodingFunction,_true>)local_8.ptr;
}

Assistant:

optional_ptr<EncodingFunction> DBConfig::GetEncodeFunction(const string &name) const {
	lock_guard<mutex> l(encoding_functions->lock);
	// Check if the function is already loaded into the global compression functions.
	if (encoding_functions->functions.find(name) != encoding_functions->functions.end()) {
		return &encoding_functions->functions[name];
	}
	return nullptr;
}